

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O2

void __thiscall MultiANN::~MultiANN(MultiANN *this)

{
  annDeallocPts(&this->points_coor);
  if (this->points_ptr != (void **)0x0) {
    operator_delete__(this->points_ptr);
  }
  annDeallocPt(&this->scaling);
  if (this->topology != (int *)0x0) {
    operator_delete__(this->topology);
    return;
  }
  return;
}

Assistant:

MultiANN::~MultiANN()  // destructor
{
    annDeallocPts(points_coor);  // deallocate coordinates of data points
    delete[] points_ptr;         // deallocate pointers to data points
    annDeallocPt(scaling);       // deallocate scaling
    delete[] topology;           // deallocate topology
}